

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

uint64_t ecs_os_time_now(void)

{
  undefined1 local_20 [8];
  timespec ts;
  uint64_t now;
  
  _ecs_assert(ecs_os_time_initialized != 0,0xc,(char *)0x0,"ecs_os_time_initialized != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/misc.c"
              ,0xbb);
  if (ecs_os_time_initialized != 0) {
    clock_gettime(1,(timespec *)local_20);
    return (long)local_20 * 1000000000 + ts.tv_sec;
  }
  __assert_fail("ecs_os_time_initialized != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/misc.c"
                ,0xbb,"uint64_t ecs_os_time_now(void)");
}

Assistant:

uint64_t ecs_os_time_now(void) {
    ecs_assert(ecs_os_time_initialized != 0, ECS_INTERNAL_ERROR, NULL);

    uint64_t now;

    #if defined(_WIN32)
        LARGE_INTEGER qpc_t;
        QueryPerformanceCounter(&qpc_t);
        now = (uint64_t)(qpc_t.QuadPart / _ecs_os_time_win_freq);
    #elif defined(__APPLE__) && defined(__MACH__)
        now = (uint64_t) int64_muldiv((int64_t)mach_absolute_time(), (int64_t)_ecs_os_time_osx_timebase.numer, (int64_t)_ecs_os_time_osx_timebase.denom);
    #else
        struct timespec ts;
        clock_gettime(CLOCK_MONOTONIC, &ts);
        now = ((uint64_t)ts.tv_sec * 1000000000 + (uint64_t)ts.tv_nsec);
    #endif

    return now;
}